

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usbcam.cpp
# Opt level: O3

void __thiscall Webcam::Webcam(Webcam *this,char *devName,uint width,uint height)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  __mode_t _Var4;
  int iVar5;
  void *pvVar6;
  int *piVar7;
  undefined8 extraout_RAX;
  uint *arg;
  long lVar8;
  Webcam *this_00;
  char *pcVar9;
  ulong uVar10;
  v4l2_buf_type type;
  v4l2_crop crop;
  v4l2_capability cap;
  undefined1 auStack_22c [4];
  uint *puStack_228;
  Webcam *pWStack_220;
  ulong local_214;
  undefined4 local_20c;
  undefined8 local_208;
  uint local_200 [16];
  ulong uStack_1c0;
  ulong local_1b8;
  undefined8 uStack_1b0;
  stat local_1a8;
  undefined4 local_d8;
  undefined8 local_d4;
  undefined8 uStack_cc;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined1 local_98 [84];
  uint local_44;
  
  arg = (uint *)(ulong)height;
  this->isOpen = false;
  pWStack_220 = (Webcam *)0x116e96;
  dev_name = devName;
  iVar2 = stat(devName,(stat *)(local_200 + 0x16));
  if (iVar2 == -1) {
    pWStack_220 = (Webcam *)0x117206;
    Webcam((Webcam *)devName);
LAB_00117214:
    this->isOpen = false;
    return;
  }
  if ((local_1a8.st_mode & 0xf000) != 0x2000) {
    pWStack_220 = (Webcam *)0x11720d;
    Webcam((Webcam *)devName);
    goto LAB_00117214;
  }
  pWStack_220 = (Webcam *)0x116ecb;
  this_00 = (Webcam *)dev_name;
  uVar3 = open(dev_name,0x802,0);
  fd = uVar3;
  if (uVar3 == 0xffffffff) {
    pWStack_220 = (Webcam *)0x117214;
    Webcam(this_00);
    goto LAB_00117214;
  }
  this->isOpen = true;
  pcVar9 = (char *)(ulong)uVar3;
  pWStack_220 = (Webcam *)0x116ef2;
  iVar2 = xioctl(uVar3,-0x7f97aa00,local_98);
  if (iVar2 == -1) goto LAB_0011723e;
  if ((local_44 & 1) == 0) goto LAB_0011724d;
  if ((local_44 >> 0x1a & 1) == 0) goto LAB_00117252;
  local_b0 = 0;
  uStack_a8 = 0;
  local_c0 = 0;
  uStack_b8 = 0;
  local_a0 = 0;
  local_c4 = 1;
  pWStack_220 = (Webcam *)0x116f45;
  iVar2 = xioctl(fd,-0x3fd3a9c6,&local_c4);
  if (iVar2 == 0) {
    local_d8 = 1;
    local_d4 = local_b0;
    uStack_cc = uStack_a8;
    pWStack_220 = (Webcam *)0x116f73;
    xioctl(fd,0x4014563c,&local_d8);
  }
  this = (Webcam *)(local_200 + 0x16);
  pWStack_220 = (Webcam *)0x116f87;
  memset(this,0,0xd0);
  local_1a8.st_dev._0_4_ = 1;
  local_1a8.st_ino = CONCAT44(height,width);
  local_1a8.st_nlink = 0x447504a4d;
  pWStack_220 = (Webcam *)0x116fb7;
  iVar2 = xioctl(fd,-0x3f2fa9fb,this);
  if (iVar2 == -1) goto LAB_00117257;
  iVar2 = (int)local_1a8.st_ino;
  this = (Webcam *)(local_1a8.st_ino & 0xffffffff);
  iVar1 = local_1a8.st_ino._4_4_;
  uVar3 = (int)local_1a8.st_ino * 2;
  _Var4 = local_1a8.st_mode;
  if (local_1a8.st_mode < uVar3) {
    local_1a8.st_mode = uVar3;
    _Var4 = uVar3;
  }
  if (local_1a8.st_uid < _Var4 * local_1a8.st_ino._4_4_) {
    local_1a8.st_uid = _Var4 * local_1a8.st_ino._4_4_;
  }
  local_208 = 0;
  local_214 = 0x100000004;
  local_20c = 1;
  pcVar9 = (char *)(ulong)(uint)fd;
  pWStack_220 = (Webcam *)0x117025;
  iVar5 = xioctl(fd,-0x3feba9f8,&local_214);
  if (iVar5 == -1) goto LAB_00117263;
  pcVar9 = (char *)(local_214 & 0xffffffff);
  if (pcVar9 < (Webcam *)0x2) goto LAB_00117272;
  pWStack_220 = (Webcam *)0x117046;
  buffers = (buffer *)calloc((size_t)pcVar9,0x10);
  if (buffers == (buffer *)0x0) goto LAB_00117277;
  n_buffers = 0;
  arg = local_200;
  do {
    local_1b8 = 0;
    uStack_1b0 = 0;
    uStack_1c0 = 0;
    local_200[10] = 0;
    local_200[0xb] = 0;
    local_200[0xc] = 0;
    local_200[0xd] = 0;
    local_200[6] = 0;
    local_200[7] = 0;
    local_200[8] = 0;
    local_200[9] = 0;
    local_200[2] = 0;
    local_200[3] = 0;
    local_200[4] = 0;
    local_200[5] = 0;
    local_200[1] = 1;
    local_200[0xe] = 0;
    local_200[0xf] = 1;
    pWStack_220 = (Webcam *)0x1170ae;
    local_200[0] = n_buffers;
    iVar5 = xioctl(fd,-0x3fa7a9f7,arg);
    if (iVar5 == -1) {
      pWStack_220 = (Webcam *)0x117226;
      errno_exit("VIDIOC_QUERYBUF");
LAB_00117226:
      pWStack_220 = (Webcam *)0x117232;
      errno_exit("mmap");
      goto LAB_00117232;
    }
    buffers[n_buffers].length = local_1b8 & 0xffffffff;
    pWStack_220 = (Webcam *)0x1170ee;
    pvVar6 = mmap((void *)0x0,local_1b8 & 0xffffffff,3,1,fd,uStack_1c0 & 0xffffffff);
    uVar3 = n_buffers;
    uVar10 = (ulong)n_buffers;
    buffers[uVar10].start = pvVar6;
    if (buffers[uVar10].start == (void *)0xffffffffffffffff) goto LAB_00117226;
    n_buffers = uVar3 + 1;
  } while (n_buffers < (uint)local_214);
  if (n_buffers != 0) {
    uVar3 = 0;
    arg = local_200 + 0x16;
    do {
      local_1a8.st_atim.tv_sec = 0;
      local_1a8.st_atim.tv_nsec = 0;
      local_1a8.st_blocks = 0;
      local_1a8.st_rdev = 0;
      local_1a8.st_size = 0;
      local_1a8.st_mode = 0;
      local_1a8.st_uid = 0;
      local_1a8.st_gid = 0;
      local_1a8.__pad0 = 0;
      local_1a8.st_ino = 0;
      local_1a8.st_nlink = 0;
      local_1a8.st_dev._4_4_ = 1;
      local_1a8.st_blksize = 0x100000000;
      pWStack_220 = (Webcam *)0x117186;
      local_1a8.st_dev._0_4_ = uVar3;
      iVar5 = xioctl(fd,-0x3fa7a9f1,arg);
      if (iVar5 == -1) goto LAB_00117232;
      uVar3 = uVar3 + 1;
    } while (uVar3 < n_buffers);
  }
  local_1a8.st_dev._0_4_ = 1;
  pWStack_220 = (Webcam *)0x1171b6;
  iVar5 = xioctl(fd,0x40045612,local_200 + 0x16);
  if (iVar5 != -1) {
    imgBuffer[0].size = (int)buffers->length;
    imgBuffer[0].width = iVar2;
    imgBuffer[0].height = iVar1;
    imgBuffer[1].width = iVar2;
    imgBuffer[1].height = iVar1;
    imgBuffer[1].size = imgBuffer[0].size;
    return;
  }
LAB_0011727c:
  pWStack_220 = (Webcam *)0x117288;
  errno_exit("VIDIOC_STREAMON");
  goto LAB_00117288;
LAB_00117232:
  pcVar9 = "VIDIOC_QBUF";
  pWStack_220 = (Webcam *)0x11723e;
  errno_exit("VIDIOC_QBUF");
LAB_0011723e:
  pWStack_220 = (Webcam *)0x117243;
  piVar7 = __errno_location();
  if (*piVar7 == 0x16) {
    pWStack_220 = (Webcam *)0x11724d;
    Webcam((Webcam *)pcVar9);
LAB_0011724d:
    pWStack_220 = (Webcam *)0x117252;
    Webcam((Webcam *)pcVar9);
LAB_00117252:
    pWStack_220 = (Webcam *)0x117257;
    Webcam((Webcam *)pcVar9);
LAB_00117257:
    pcVar9 = "VIDIOC_S_FMT";
    pWStack_220 = (Webcam *)0x117263;
    errno_exit("VIDIOC_S_FMT");
LAB_00117263:
    pWStack_220 = (Webcam *)0x117268;
    piVar7 = __errno_location();
    if (*piVar7 != 0x16) goto LAB_00117294;
    pWStack_220 = (Webcam *)0x117272;
    Webcam((Webcam *)pcVar9);
LAB_00117272:
    pWStack_220 = (Webcam *)0x117277;
    Webcam((Webcam *)pcVar9);
LAB_00117277:
    pWStack_220 = (Webcam *)0x11727c;
    Webcam((Webcam *)pcVar9);
    goto LAB_0011727c;
  }
LAB_00117288:
  pWStack_220 = (Webcam *)0x117294;
  errno_exit("VIDIOC_QUERYCAP");
LAB_00117294:
  pcVar9 = "VIDIOC_REQBUFS";
  pWStack_220 = (Webcam *)~Webcam;
  errno_exit("VIDIOC_REQBUFS");
  if (*pcVar9 != '\x01') {
    return;
  }
  puStack_228 = arg;
  pWStack_220 = this;
  if (((byte)isRun._M_base._M_i & 1) != 0) {
    LOCK();
    isRun._M_base._M_i = (__atomic_base<bool>)false;
    UNLOCK();
    std::thread::join();
  }
  iVar2 = xioctl(fd,0x40045613,auStack_22c);
  if (iVar2 == -1) {
LAB_00117362:
    errno_exit("VIDIOC_STREAMOFF");
  }
  else {
    if (n_buffers != 0) {
      lVar8 = 8;
      uVar10 = 0;
      do {
        iVar2 = munmap(*(void **)((long)buffers + lVar8 + -8),
                       *(size_t *)((long)&buffers->start + lVar8));
        if (iVar2 == -1) {
          errno_exit("munmap");
          goto LAB_00117362;
        }
        uVar10 = uVar10 + 1;
        lVar8 = lVar8 + 0x10;
      } while (uVar10 < n_buffers);
    }
    free(buffers);
    iVar2 = close(fd);
    if (iVar2 != -1) {
      fd = -1;
      return;
    }
  }
  errno_exit("close");
  __clang_call_terminate(extraout_RAX);
  if (((byte)isRun._M_base._M_i & 1) == 0) {
    return;
  }
  LOCK();
  isRun._M_base._M_i = (__atomic_base<bool>)false;
  UNLOCK();
  std::thread::join();
  return;
}

Assistant:

Webcam::Webcam(const char *devName, unsigned int width, unsigned int height)
{
    dev_name = (char *)devName;
    if(!open_device()) {
        isOpen = false;
        return;
    }
    isOpen = true;
    init_device (width, height);    //此处 若不适配的分辨率会自动被更正
    start_capturing ();

    for(int i=0; i<2; i++) {
        imgBuffer[i].size = buffers[0].length;
        imgBuffer[i].width  = width;
        imgBuffer[i].height = height;
    }
}